

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode Curl_update_timer(Curl_multi *multi)

{
  CURLMcode CVar1;
  int iVar2;
  uint local_30;
  uint local_2c;
  uint local_28;
  long lStack_20;
  int rc;
  long timeout_ms;
  Curl_multi *multi_local;
  
  if ((multi->timer_cb == (curl_multi_timer_callback)0x0) || ((multi->dead & 1U) != 0)) {
    multi_local._4_4_ = CURLM_OK;
  }
  else {
    timeout_ms = (long)multi;
    CVar1 = multi_timeout(multi,&stack0xffffffffffffffe0);
    if (CVar1 == CURLM_OK) {
      if (lStack_20 < 0) {
        if ((((*(long *)(timeout_ms + 0x168) < 1) && (-1 < *(long *)(timeout_ms + 0x168))) &&
            (*(int *)(timeout_ms + 0x170) < 1)) && (-1 < *(int *)(timeout_ms + 0x170))) {
          multi_local._4_4_ = CURLM_OK;
        }
        else {
          *(time_t *)(timeout_ms + 0x168) = 0;
          *(undefined8 *)(timeout_ms + 0x170) = 0;
          set_in_callback((Curl_multi *)timeout_ms,true);
          iVar2 = (**(code **)(timeout_ms + 0x158))
                            (timeout_ms,0xffffffffffffffff,*(undefined8 *)(timeout_ms + 0x160));
          set_in_callback((Curl_multi *)timeout_ms,false);
          if (iVar2 == -1) {
            *(undefined1 *)(timeout_ms + 0x189) = 1;
            multi_local._4_4_ = CURLM_ABORTED_BY_CALLBACK;
          }
          else {
            multi_local._4_4_ = CURLM_OK;
          }
        }
      }
      else {
        if (*(long *)(*(long *)(timeout_ms + 0xb0) + 0x20) < *(long *)(timeout_ms + 0x168)) {
          local_28 = 0xffffffff;
        }
        else {
          if (*(long *)(timeout_ms + 0x168) < *(long *)(*(long *)(timeout_ms + 0xb0) + 0x20)) {
            local_2c = 1;
          }
          else {
            if (*(int *)(*(long *)(timeout_ms + 0xb0) + 0x28) < *(int *)(timeout_ms + 0x170)) {
              local_30 = 0xffffffff;
            }
            else {
              local_30 = (uint)(*(int *)(timeout_ms + 0x170) <
                               *(int *)(*(long *)(timeout_ms + 0xb0) + 0x28));
            }
            local_2c = local_30;
          }
          local_28 = local_2c;
        }
        if (local_28 == 0) {
          multi_local._4_4_ = CURLM_OK;
        }
        else {
          *(undefined8 *)(timeout_ms + 0x168) = *(undefined8 *)(*(long *)(timeout_ms + 0xb0) + 0x20)
          ;
          *(undefined8 *)(timeout_ms + 0x170) = *(undefined8 *)(*(long *)(timeout_ms + 0xb0) + 0x28)
          ;
          set_in_callback((Curl_multi *)timeout_ms,true);
          iVar2 = (**(code **)(timeout_ms + 0x158))
                            (timeout_ms,lStack_20,*(undefined8 *)(timeout_ms + 0x160));
          set_in_callback((Curl_multi *)timeout_ms,false);
          if (iVar2 == -1) {
            *(undefined1 *)(timeout_ms + 0x189) = 1;
            multi_local._4_4_ = CURLM_ABORTED_BY_CALLBACK;
          }
          else {
            multi_local._4_4_ = CURLM_OK;
          }
        }
      }
    }
    else {
      multi_local._4_4_ = CURLM_OK;
    }
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode Curl_update_timer(struct Curl_multi *multi)
{
  long timeout_ms;
  int rc;

  if(!multi->timer_cb || multi->dead)
    return CURLM_OK;
  if(multi_timeout(multi, &timeout_ms)) {
    return CURLM_OK;
  }
  if(timeout_ms < 0) {
    static const struct curltime none = {0, 0};
    if(Curl_splaycomparekeys(none, multi->timer_lastcall)) {
      multi->timer_lastcall = none;
      /* there's no timeout now but there was one previously, tell the app to
         disable it */
      set_in_callback(multi, TRUE);
      rc = multi->timer_cb(multi, -1, multi->timer_userp);
      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
      return CURLM_OK;
    }
    return CURLM_OK;
  }

  /* When multi_timeout() is done, multi->timetree points to the node with the
   * timeout we got the (relative) time-out time for. We can thus easily check
   * if this is the same (fixed) time as we got in a previous call and then
   * avoid calling the callback again. */
  if(Curl_splaycomparekeys(multi->timetree->key, multi->timer_lastcall) == 0)
    return CURLM_OK;

  multi->timer_lastcall = multi->timetree->key;

  set_in_callback(multi, TRUE);
  rc = multi->timer_cb(multi, timeout_ms, multi->timer_userp);
  set_in_callback(multi, FALSE);
  if(rc == -1) {
    multi->dead = TRUE;
    return CURLM_ABORTED_BY_CALLBACK;
  }
  return CURLM_OK;
}